

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O3

char * __thiscall
XPMP2::SoundSystem::EnumerateSounds(SoundSystem *this,char *prevName,char **ppFilePath)

{
  size_t sVar1;
  iterator iVar2;
  key_type local_50;
  
  if (ppFilePath != (char **)0x0) {
    *ppFilePath = (char *)0x0;
  }
  if ((this->mapSounds)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if ((prevName == (char *)0x0) || (*prevName == '\0')) {
      iVar2._M_node = (this->mapSounds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar1 = strlen(prevName);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,prevName,prevName + sVar1)
      ;
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<XPMP2::SoundFile,_std::default_delete<XPMP2::SoundFile>_>_>_>_>
              ::find(&(this->mapSounds)._M_t,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar2._M_node != &(this->mapSounds)._M_t._M_impl.super__Rb_tree_header)
      {
        iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
      }
    }
    if ((_Rb_tree_header *)iVar2._M_node != &(this->mapSounds)._M_t._M_impl.super__Rb_tree_header) {
      if ((ppFilePath != (char **)0x0) && (*(long *)(iVar2._M_node + 2) != 0)) {
        *ppFilePath = *(char **)(*(long *)(iVar2._M_node + 2) + 0x10);
      }
      return *(char **)(iVar2._M_node + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

const char* SoundSystem::EnumerateSounds (const char* prevName, const char** ppFilePath)
{
    if (ppFilePath) *ppFilePath = nullptr;

    // No sounds available at all?
    if (mapSounds.empty())
        return nullptr;
    
    auto sndIter = mapSounds.end();
    // Return first sound?
    if (!prevName || !prevName[0])
        sndIter = mapSounds.begin();
    else {
        // Try finding the given `prevName` sound, then return next
        sndIter = mapSounds.find(prevName);
        if (sndIter != mapSounds.end())
            sndIter++;
    }
    
    // Not found anything anymore?
    if (sndIter == mapSounds.end()) {
        return nullptr;
    } else {
        // Return the found element
        if (ppFilePath && sndIter->second)
            *ppFilePath = sndIter->second->filePath.c_str();
        return sndIter->first.c_str();
    }
}